

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

Float __thiscall
pbrt::RealisticCamera::TraceLensesFromFilm(RealisticCamera *this,Ray *rCamera,Ray *rOut)

{
  WrapMode aWVar1 [2];
  undefined1 auVar2 [16];
  Point2f p;
  bool bVar3;
  bool bVar4;
  size_t sVar5;
  Ray *ray;
  const_reference pvVar6;
  long in_RDX;
  long in_RSI;
  Ray *in_RDI;
  undefined1 auVar10 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  Point3f PVar11;
  Vector3<float> VVar12;
  Float eta_t;
  Float eta_i;
  Vector3f w;
  Float r2;
  Point2f uv;
  Point3f pHit;
  Float zCenter;
  Float radius;
  bool isStop;
  Normal3f n;
  Float t;
  LensElementInterface *element;
  int i;
  Ray rLens;
  Float weight;
  Float elementZ;
  float in_stack_fffffffffffffe68;
  float in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  Float in_stack_fffffffffffffe7c;
  Float *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 uVar13;
  Float in_stack_fffffffffffffeac;
  Ray *in_stack_fffffffffffffeb0;
  Vector3f *in_stack_ffffffffffffff20;
  float local_d8;
  float in_stack_ffffffffffffff2c;
  Normal3f *in_stack_ffffffffffffff30;
  Vector3f *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  array<pbrt::WrapMode,_2> wrapMode;
  float fVar14;
  float in_stack_ffffffffffffff54;
  WrapMode local_a8;
  float fStack_a4;
  Normal3f *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  Float zCenter_00;
  Float in_stack_ffffffffffffff90;
  float local_48;
  float local_3c;
  undefined4 local_38;
  Float local_28;
  float local_24;
  
  local_24 = 0.0;
  local_28 = 1.0;
  Point3<float>::Point3
            ((Point3<float> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,0.0);
  Vector3<float>::Vector3
            ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,0.0);
  uVar13 = *(undefined4 *)(in_RSI + 0x18);
  MediumHandle::TaggedPointer
            ((MediumHandle *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             (nullptr_t)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  Ray::Ray(in_RDI,(Point3f *)CONCAT44(uVar13,in_stack_fffffffffffffe88),
           (Vector3f *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
           (MediumHandle *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  sVar5 = pstd::
          vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
          ::size((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                  *)&in_RDI[0x16].medium);
  zCenter_00 = (Float)sVar5;
  while( true ) {
    do {
      zCenter_00 = (Float)((int)zCenter_00 + -1);
      if ((int)zCenter_00 < 0) {
        if (in_RDX != 0) {
          Point3<float>::Point3
                    ((Point3<float> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                     in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,0.0);
          Vector3<float>::Vector3
                    ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)
                     ,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,0.0);
          MediumHandle::TaggedPointer
                    ((MediumHandle *)CONCAT44(local_38,in_stack_fffffffffffffe70),
                     (nullptr_t)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          Ray::Ray(in_RDI,(Point3f *)CONCAT44(uVar13,in_stack_fffffffffffffe88),
                   (Vector3f *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                   (MediumHandle *)CONCAT44(local_38,in_stack_fffffffffffffe70));
          Ray::operator=((Ray *)CONCAT44(local_38,in_stack_fffffffffffffe70),
                         (Ray *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        }
        return local_28;
      }
      ray = (Ray *)pstd::
                   vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                   ::operator[]((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                                 *)&in_RDI[0x16].medium,(long)(int)zCenter_00);
      local_24 = local_24 - (ray->o).super_Tuple3<pbrt::Point3,_float>.y;
      Normal3<float>::Normal3((Normal3<float> *)0x743095);
      bVar4 = (ray->o).super_Tuple3<pbrt::Point3,_float>.x != 0.0;
      if (bVar4) {
        bVar3 = IntersectSphericalElement
                          (in_stack_ffffffffffffff90,zCenter_00,ray,
                           (Float *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           in_stack_ffffffffffffff70);
        if (!bVar3) {
          return 0.0;
        }
      }
      else {
        in_stack_ffffffffffffff7c = (local_24 - local_48) / local_3c;
        if (in_stack_ffffffffffffff7c < 0.0) {
          return 0.0;
        }
      }
      auVar10 = (undefined1  [56])0x0;
      PVar11 = Ray::operator()(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
      local_48 = PVar11.super_Tuple3<pbrt::Point3,_float>.z;
      auVar7._0_8_ = PVar11.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar7._8_56_ = auVar10;
      aWVar1 = (WrapMode  [2])vmovlpd_avx(auVar7._0_16_);
      if ((bVar4) ||
         (wrapMode.values = aWVar1, fVar14 = local_48,
         bVar3 = Image::operator_cast_to_bool((Image *)&in_RDI[0x17].time), !bVar3)) {
        local_a8 = aWVar1[0];
        fStack_a4 = aWVar1[1];
        auVar2 = vfmadd213ss_fma(ZEXT416(local_a8),ZEXT416(local_a8),
                                 ZEXT416((uint)(fStack_a4 * fStack_a4)));
        in_stack_ffffffffffffff2c = auVar2._0_4_;
        if ((ray->d).super_Tuple3<pbrt::Vector3,_float>.x *
            (ray->d).super_Tuple3<pbrt::Vector3,_float>.x < in_stack_ffffffffffffff2c) {
          return 0.0;
        }
      }
      else {
        in_stack_fffffffffffffe7c = 1.0;
        Point2<float>::Point2
                  ((Point2<float> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
        in_stack_ffffffffffffff44 = in_stack_fffffffffffffe7c - in_stack_ffffffffffffff44;
        in_stack_fffffffffffffe80 = &in_RDI[0x17].time;
        in_stack_ffffffffffffff38 =
             (Vector3f *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
        WrapMode2D::WrapMode2D
                  ((WrapMode2D *)in_stack_fffffffffffffe80,(WrapMode)in_stack_fffffffffffffe7c);
        p.super_Tuple2<pbrt::Point2,_float>.y = in_stack_ffffffffffffff54;
        p.super_Tuple2<pbrt::Point2,_float>.x = fVar14;
        local_28 = Image::BilerpChannel
                             ((Image *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                              ,p,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                              (WrapMode2D)wrapMode.values);
        if ((local_28 == 0.0) && (!NAN(local_28))) {
          return 0.0;
        }
      }
    } while (!bVar4);
    Vector3<float>::Vector3((Vector3<float> *)0x743392);
    if (0 < (int)zCenter_00) {
      pvVar6 = pstd::
               vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
               ::operator[]((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                             *)&in_RDI[0x16].medium,(long)((int)zCenter_00 + -1));
      if ((pvVar6->eta != 0.0) || (NAN(pvVar6->eta))) {
        pstd::
        vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
        ::operator[]((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                      *)&in_RDI[0x16].medium,(long)((int)zCenter_00 + -1));
      }
    }
    auVar10 = (undefined1  [56])0x0;
    VVar12 = Tuple3<pbrt::Vector3,_float>::operator-
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    auVar8._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar8._8_56_ = auVar10;
    vmovlpd_avx(auVar8._0_16_);
    VVar12 = Normalize<float>((Vector3<float> *)in_RDI);
    auVar9._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar9._8_56_ = auVar10;
    vmovlpd_avx(auVar9._0_16_);
    bVar4 = Refract(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                    in_stack_ffffffffffffff20);
    if (((bVar4 ^ 0xffU) & 1) != 0) break;
    local_3c = local_d8;
  }
  return 0.0;
}

Assistant:

Float RealisticCamera::TraceLensesFromFilm(const Ray &rCamera, Ray *rOut) const {
    Float elementZ = 0, weight = 1;
    // Transform _rCamera_ from camera to lens system space
    Ray rLens(Point3f(rCamera.o.x, rCamera.o.y, -rCamera.o.z),
              Vector3f(rCamera.d.x, rCamera.d.y, -rCamera.d.z), rCamera.time);

    for (int i = elementInterfaces.size() - 1; i >= 0; --i) {
        const LensElementInterface &element = elementInterfaces[i];
        // Update ray from film accounting for interaction with _element_
        elementZ -= element.thickness;
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        bool isStop = (element.curvatureRadius == 0);
        if (isStop) {
            // Compute _t_ at plane of aperture stop
            t = (elementZ - rLens.o.z) / rLens.d.z;
            if (t < 0)
                return 0;

        } else {
            // Intersect ray with element to compute _t_ and _n_
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, rLens, &t, &n))
                return 0;
        }
        DCHECK_GE(t, 0);

        // Test intersection point against element aperture
        Point3f pHit = rLens(t);
        if (isStop && apertureImage) {
            // Check intersection point against _apertureImage_
            Point2f uv((pHit.x / element.apertureRadius + 1) / 2,
                       (pHit.y / element.apertureRadius + 1) / 2);
            uv.y = 1 - uv.y;
            weight = apertureImage.BilerpChannel(uv, 0, WrapMode::Black);
            if (weight == 0)
                return 0;

        } else {
            // Check intersection point against spherical aperture
            Float r2 = pHit.x * pHit.x + pHit.y * pHit.y;
            if (r2 > element.apertureRadius * element.apertureRadius)
                return 0;
        }
        rLens.o = pHit;

        // Update ray path for element interface interaction
        if (!isStop) {
            Vector3f w;
            Float eta_i = element.eta;
            Float eta_t = (i > 0 && elementInterfaces[i - 1].eta != 0)
                              ? elementInterfaces[i - 1].eta
                              : 1;
            if (!Refract(Normalize(-rLens.d), n, eta_t / eta_i, &w))
                return 0;
            rLens.d = w;
        }
    }
    // Transform _rLens_ from lens system space back to camera space
    if (rOut != nullptr)
        *rOut = Ray(Point3f(rLens.o.x, rLens.o.y, -rLens.o.z),
                    Vector3f(rLens.d.x, rLens.d.y, -rLens.d.z), rLens.time);

    return weight;
}